

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

void __thiscall wasm::AlignmentLowering::visitLoad(AlignmentLowering *this,Load *curr)

{
  ulong uVar1;
  Type type;
  address64_t aVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  address64_t aVar6;
  BasicType BVar7;
  Index index;
  Memory *pMVar8;
  LocalSet *left;
  LocalGet *pLVar9;
  Load *pLVar10;
  Expression *pEVar11;
  Unary *left_00;
  Unary *left_01;
  Const *right;
  Binary *pBVar12;
  Block *value;
  UnaryOp op;
  Builder local_38;
  Builder builder;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id == 1) {
    Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                ).
                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                .
                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
               ,curr->ptr);
    return;
  }
  uVar1 = (curr->align).addr;
  if (uVar1 == 0) {
    return;
  }
  if (uVar1 == curr->bytes) {
    return;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  BVar7 = wasm::Type::getBasic
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type);
  if (3 < BVar7 - i32) {
    handle_unreachable("unhandled unaligned load",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                       ,0x103);
  }
  switch(BVar7) {
  case i32:
    value = (Block *)lowerLoadI32(this,curr);
    break;
  case i64:
    if (curr->bytes != '\b') {
      (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      op = curr->signed_ ^ ExtendUInt32;
      pEVar11 = lowerLoadI32(this,curr);
      goto LAB_007be858;
    }
  case f64:
    pMVar8 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    type.id = (pMVar8->indexType).id;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,type);
    left = Builder::makeLocalSet(&local_38,index,curr->ptr);
    aVar2 = (curr->offset).addr;
    aVar6 = (curr->align).addr;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar9->index = index;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    sVar3 = (curr->memory).super_IString.str._M_len;
    pcVar4 = (curr->memory).super_IString.str._M_str;
    pLVar10 = MixedArena::alloc<wasm::Load>(&(local_38.wasm)->allocator);
    pLVar10->isAtomic = false;
    pLVar10->bytes = '\x04';
    pLVar10->signed_ = false;
    (pLVar10->offset).addr = aVar2;
    (pLVar10->align).addr = (ulong)(uint)aVar6;
    pLVar10->ptr = (Expression *)pLVar9;
    (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar10->memory).super_IString.str._M_len = sVar3;
    (pLVar10->memory).super_IString.str._M_str = pcVar4;
    pEVar11 = lowerLoadI32(this,pLVar10);
    left_00 = Builder::makeUnary(&local_38,ExtendUInt32,pEVar11);
    aVar2 = (curr->offset).addr;
    uVar5 = (curr->align).addr;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar9->index = index;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    sVar3 = (curr->memory).super_IString.str._M_len;
    pcVar4 = (curr->memory).super_IString.str._M_str;
    pLVar10 = MixedArena::alloc<wasm::Load>(&(local_38.wasm)->allocator);
    pLVar10->isAtomic = false;
    pLVar10->bytes = '\x04';
    pLVar10->signed_ = false;
    uVar1 = DAT_00b8f490._8_8_;
    (pLVar10->offset).addr = aVar2 + 4;
    (pLVar10->align).addr = uVar5 & uVar1;
    pLVar10->ptr = (Expression *)pLVar9;
    (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar10->memory).super_IString.str._M_len = sVar3;
    (pLVar10->memory).super_IString.str._M_str = pcVar4;
    pEVar11 = lowerLoadI32(this,pLVar10);
    left_01 = Builder::makeUnary(&local_38,ExtendUInt32,pEVar11);
    right = Builder::makeConst<long>(&local_38,0x20);
    pBVar12 = Builder::makeBinary(&local_38,ShlInt64,(Expression *)left_01,(Expression *)right);
    pBVar12 = Builder::makeBinary(&local_38,OrInt64,(Expression *)left_00,(Expression *)pBVar12);
    value = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)pBVar12);
    if (BVar7 == f64) {
      value = (Block *)Builder::makeUnary(&local_38,ReinterpretInt64,(Expression *)value);
    }
    break;
  case f32:
    (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    pEVar11 = lowerLoadI32(this,curr);
    op = ReinterpretInt32;
LAB_007be858:
    value = (Block *)Builder::makeUnary(&local_38,op,pEVar11);
  }
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
              ).
              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
              .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>,
             (Expression *)value);
  return;
}

Assistant:

void visitLoad(Load* curr) {
    // If unreachable, just remove the load, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(curr->ptr);
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    Builder builder(*getModule());
    auto type = curr->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned load");
      case Type::i32:
        replacement = lowerLoadI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        replacement = builder.makeUnary(ReinterpretInt32, lowerLoadI32(curr));
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A load of <64 bits.
          curr->type = Type::i32;
          replacement = builder.makeUnary(
            curr->signed_ ? ExtendSInt32 : ExtendUInt32, lowerLoadI32(curr));
          break;
        }
        // Load two 32-bit pieces, and combine them.
        auto mem = getModule()->getMemory(curr->memory);
        auto indexType = mem->indexType;
        auto temp = builder.addVar(getFunction(), indexType);
        auto* set = builder.makeLocalSet(temp, curr->ptr);
        Expression* low =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset,
                                        curr->align,
                                        builder.makeLocalGet(temp, indexType),
                                        Type::i32,
                                        curr->memory));
        low = builder.makeUnary(ExtendUInt32, low);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned load, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        Expression* high =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset + 4,
                                        curr->align,
                                        builder.makeLocalGet(temp, indexType),
                                        Type::i32,
                                        curr->memory));
        high = builder.makeUnary(ExtendUInt32, high);
        high =
          builder.makeBinary(ShlInt64, high, builder.makeConst(int64_t(32)));
        auto* combined = builder.makeBinary(OrInt64, low, high);
        replacement = builder.makeSequence(set, combined);
        // Ensure the proper output type.
        if (type == Type::f64) {
          replacement = builder.makeUnary(ReinterpretInt64, replacement);
        }
        break;
    }
    replaceCurrent(replacement);
  }